

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O0

void __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Clear
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this)

{
  long lVar1;
  long *in_RDI;
  bool bVar2;
  ChunkHeader *next;
  
  while( true ) {
    bVar2 = false;
    if (*in_RDI != 0) {
      bVar2 = *in_RDI != in_RDI[2];
    }
    if (!bVar2) break;
    lVar1 = *(long *)(*in_RDI + 0x10);
    CrtAllocator::Free((void *)0x4b4e1a);
    *in_RDI = lVar1;
  }
  if ((*in_RDI != 0) && (*in_RDI == in_RDI[2])) {
    *(undefined8 *)(*in_RDI + 8) = 0;
  }
  return;
}

Assistant:

void Clear() {
        while (chunkHead_ && chunkHead_ != userBuffer_) {
            ChunkHeader* next = chunkHead_->next;
            baseAllocator_->Free(chunkHead_);
            chunkHead_ = next;
        }
        if (chunkHead_ && chunkHead_ == userBuffer_)
            chunkHead_->size = 0; // Clear user buffer
    }